

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectMesh(XFileParser *this,Mesh *pMesh)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  reference pvVar6;
  reference this_00;
  ulong uVar7;
  Logger *this_01;
  aiVector3D aVar8;
  int local_d8;
  allocator local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string objectName;
  bool running;
  uint local_84;
  int idx;
  uint b;
  Face *face;
  uint local_70;
  uint numIndices;
  uint a_1;
  uint numPosFaces;
  uint local_4c;
  uint a;
  uint numVertices;
  undefined1 local_38 [8];
  string name;
  Mesh *pMesh_local;
  XFileParser *this_local;
  
  name.field_2._8_8_ = pMesh;
  std::__cxx11::string::string((string *)local_38);
  readHeadOfDataObject(this,(string *)local_38);
  uVar2 = ReadInt(this);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             (name.field_2._8_8_ + 0x20),(ulong)uVar2);
  for (local_4c = 0; local_4c < uVar2; local_4c = local_4c + 1) {
    aVar8 = ReadVector3(this);
    pvVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        (name.field_2._8_8_ + 0x20),(ulong)local_4c);
    pvVar6->x = (float)(int)aVar8._0_8_;
    pvVar6->y = (float)(int)((ulong)aVar8._0_8_ >> 0x20);
    pvVar6->z = aVar8.z;
  }
  uVar3 = ReadInt(this);
  std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::resize
            ((vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_> *)
             (name.field_2._8_8_ + 0x38),(ulong)uVar3);
  for (local_70 = 0; local_70 < uVar3; local_70 = local_70 + 1) {
    uVar4 = ReadInt(this);
    this_00 = std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::operator[]
                        ((vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_> *)
                         (name.field_2._8_8_ + 0x38),(ulong)local_70);
    for (local_84 = 0; local_84 < uVar4; local_84 = local_84 + 1) {
      uVar5 = ReadInt(this);
      if (uVar5 <= uVar2) {
        objectName.field_2._12_4_ = uVar5;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this_00->mIndices,
                   (value_type_conflict4 *)(objectName.field_2._M_local_buf + 0xc));
      }
    }
    TestForSeparator(this);
  }
  objectName.field_2._M_local_buf[0xb] = '\x01';
  do {
    if ((objectName.field_2._M_local_buf[0xb] & 1U) == 0) break;
    GetNextToken_abi_cxx11_((string *)local_b0,this);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d0,"Unexpected end of file while parsing mesh structure",&local_d1
                );
      ThrowException(this,&local_d0);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"}");
    if (bVar1) {
      local_d8 = 0xc;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,"MeshNormals");
      if (bVar1) {
        ParseDataObjectMeshNormals(this,(Mesh *)name.field_2._8_8_);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0,"MeshTextureCoords");
        if (bVar1) {
          ParseDataObjectMeshTextureCoords(this,(Mesh *)name.field_2._8_8_);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b0,"MeshVertexColors");
          if (bVar1) {
            ParseDataObjectMeshVertexColors(this,(Mesh *)name.field_2._8_8_);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b0,"MeshMaterialList");
            if (bVar1) {
              ParseDataObjectMeshMaterialList(this,(Mesh *)name.field_2._8_8_);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b0,"VertexDuplicationIndices");
              if (bVar1) {
                ParseUnknownDataObject(this);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b0,"XSkinMeshHeader");
                if (bVar1) {
                  ParseDataObjectSkinMeshHeader(this,(Mesh *)name.field_2._8_8_);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b0,"SkinWeights");
                  if (bVar1) {
                    ParseDataObjectSkinWeights(this,(Mesh *)name.field_2._8_8_);
                  }
                  else {
                    this_01 = DefaultLogger::get();
                    Logger::warn(this_01,"Unknown data object in mesh in x file");
                    ParseUnknownDataObject(this);
                  }
                }
              }
            }
          }
        }
      }
      local_d8 = 0;
    }
    std::__cxx11::string::~string((string *)local_b0);
  } while (local_d8 == 0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XFileParser::ParseDataObjectMesh( Mesh* pMesh)
{
    std::string name;
    readHeadOfDataObject( &name);

    // read vertex count
    unsigned int numVertices = ReadInt();
    pMesh->mPositions.resize( numVertices);

    // read vertices
    for( unsigned int a = 0; a < numVertices; a++)
        pMesh->mPositions[a] = ReadVector3();

    // read position faces
    unsigned int numPosFaces = ReadInt();
    pMesh->mPosFaces.resize( numPosFaces);
    for( unsigned int a = 0; a < numPosFaces; ++a) {
        // read indices
        unsigned int numIndices = ReadInt();
        Face& face = pMesh->mPosFaces[a];
        for (unsigned int b = 0; b < numIndices; ++b) {
            const int idx( ReadInt() );
            if ( static_cast<unsigned int>( idx ) <= numVertices ) {
                face.mIndices.push_back( idx );
            }
        }
        TestForSeparator();
    }

    // here, other data objects may follow
    bool running = true;
    while ( running ) {
        std::string objectName = GetNextToken();

        if( objectName.empty() )
            ThrowException( "Unexpected end of file while parsing mesh structure");
        else
        if( objectName == "}")
            break; // mesh finished
        else
        if( objectName == "MeshNormals")
            ParseDataObjectMeshNormals( pMesh);
        else
        if( objectName == "MeshTextureCoords")
            ParseDataObjectMeshTextureCoords( pMesh);
        else
        if( objectName == "MeshVertexColors")
            ParseDataObjectMeshVertexColors( pMesh);
        else
        if( objectName == "MeshMaterialList")
            ParseDataObjectMeshMaterialList( pMesh);
        else
        if( objectName == "VertexDuplicationIndices")
            ParseUnknownDataObject(); // we'll ignore vertex duplication indices
        else
        if( objectName == "XSkinMeshHeader")
            ParseDataObjectSkinMeshHeader( pMesh);
        else
        if( objectName == "SkinWeights")
            ParseDataObjectSkinWeights( pMesh);
        else
        {
            ASSIMP_LOG_WARN("Unknown data object in mesh in x file");
            ParseUnknownDataObject();
        }
    }
}